

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_02;
  undefined8 *puVar1;
  pointer ppVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  pair<const_int,_int> pVar6;
  char *in_R9;
  bool bVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  TypeParam ht;
  AssertHelper local_1d8;
  AssertHelper local_1d0;
  undefined8 *local_1c8;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_1c0;
  undefined1 local_1a8 [32];
  pointer ppStack_188;
  pointer local_180;
  AssertHelper local_178;
  undefined8 *puStack_170;
  pointer local_168;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_160;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_158;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_140;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_138;
  pointer ppStack_130;
  pointer local_128;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_120;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  long *plStack_100;
  undefined1 *local_f8;
  pointer ppStack_f0;
  pointer local_e8;
  long *plStack_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer ppStack_b8;
  pointer local_b0;
  long local_78;
  void *local_60;
  iterator local_58;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_40;
  
  local_140 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_120 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_e8 = (pointer)0x0;
  plStack_e0 = (long *)0x0;
  local_f8 = (undefined1 *)0x0;
  ppStack_f0 = (pointer)0x0;
  local_118.end = (pointer)0x0;
  plStack_100 = (long *)0x0;
  local_118.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_118.pos = (pointer)0x0;
  bVar7 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_elements ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_1a8[0] = (internal)bVar7;
  local_1a8._8_8_ = (pointer)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)local_1a8,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ae,(char *)local_d8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  this_01 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_d8,&this_01->rep,(int *)&local_1c0);
  local_1a8._8_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table +
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_1a8._0_8_ = this_01;
  local_1a8._16_8_ = local_1a8._8_8_;
  local_c8._8_8_ = this_00;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1a8);
  local_178.data_._0_4_ = CONCAT31(local_178.data_._1_3_,local_d8._8_8_ == local_1a8._8_8_);
  puStack_170 = (undefined8 *)0x0;
  if (local_d8._8_8_ != local_1a8._8_8_) {
    testing::Message::Message((Message *)local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_178,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) == this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2af,(char *)local_d8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_);
    }
    if ((value_type)local_1a8._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  puVar1 = puStack_170;
  if (puStack_170 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_170 != puStack_170 + 2) {
      operator_delete((undefined8 *)*puStack_170);
    }
    operator_delete(puVar1);
  }
  local_178.data_._0_4_ = 0;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_1c0);
  local_1a8._1_7_ = 0;
  local_1a8[0] = (internal)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_d8,"0u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_178,
             (unsigned_long *)local_1a8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((pointer)local_d8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b0,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((value_type)local_1a8._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  uVar3 = local_d8._8_8_;
  if ((pointer)local_d8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_d8._8_8_ != (pair<const_int,_int>)(local_d8._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_d8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1a8._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_d8,&this_01->rep,(int *)local_1a8);
  local_158.end = (pointer)local_c8._M_allocated_capacity;
  local_158.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_d8._0_8_;
  local_158.pos = (pointer)local_d8._8_8_;
  local_138 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8._8_8_;
  ppStack_130 = ppStack_b8;
  local_128 = local_b0;
  local_1a8[0] = (internal)((pointer)local_d8._8_8_ == ppStack_b8);
  local_1a8._8_8_ = (pointer)0x0;
  local_140 = this_00;
  local_120 = this_00;
  if ((pointer)local_d8._8_8_ != ppStack_b8) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)local_1a8,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b2,(char *)local_d8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  bVar7 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_elements !=
          (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_1a8[0] = (internal)bVar7;
  local_1a8._8_8_ = (pointer)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)local_1a8,(AssertionResult *)"this->ht_.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b5,(char *)local_d8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xb);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x1b207);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x10f447);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xa98ac7);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_1a8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x69f6bc7);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_d8,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_1a8);
  local_178.data_._0_4_ = 9;
  local_1a8._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_elements -
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_d8,"9u","this->ht_.size()",(uint *)&local_178,
             (unsigned_long *)local_1a8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((pointer)local_d8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2be,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((value_type)local_1a8._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  uVar3 = local_d8._8_8_;
  if ((pointer)local_d8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_d8._8_8_ != (pair<const_int,_int>)(local_d8._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_d8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_d8._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_58,&this_01->rep,(int *)local_d8);
  local_178.data_._0_4_ = local_58.ht._0_4_;
  local_178.data_._4_4_ = local_58.ht._4_4_;
  local_168 = local_58.end;
  local_160 = this_00;
  local_40 = this_00;
  iVar4 = (*(this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[0xb])(this_00);
  local_1a8._0_4_ = iVar4;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"it.key()","this->UniqueKey(1)",(int *)local_1a8,(int *)&local_1c0
            );
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((pointer)local_d8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c0,(char *)pVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((value_type)local_1a8._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if ((pointer)local_d8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_d8._8_8_ != (pair<const_int,_int>)(local_d8._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_d8._8_8_);
    }
    operator_delete((void *)local_d8._8_8_);
  }
  this_02 = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_d8 + 8);
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c233e8;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::dense_hashtable(this_02,&this_01->rep,0x20);
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c23368;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_1a8,&this_01->rep,(int *)&local_1d8);
  local_1c0.pos =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table +
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_1c0.ht = &this_01->rep;
  local_1c0.end = local_1c0.pos;
  local_1a8._24_8_ = this_00;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ != local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ == local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) != this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c6,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&(((ht *)&(local_1c0.ht)->settings)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 1;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_1d0,
             (unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c7,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,&this_01->rep,(int *)&local_1c0);
  local_158.end = (pointer)local_1a8._16_8_;
  local_158.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_158.pos = (pointer)local_1a8._8_8_;
  local_128 = local_180;
  local_138 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_1a8._24_8_;
  ppStack_130 = ppStack_188;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ != ppStack_188);
  local_1c0.pos = (pointer)0x0;
  local_140 = this_00;
  local_120 = this_00;
  if ((pointer)local_1a8._8_8_ == ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c9,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  iVar4 = (*(local_140->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,iVar4);
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d0.data_._0_4_ = pVar6.first;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"eq_pair.first.key()","this->UniqueKey(1)",(int *)&local_1c0,
             (int *)&local_1d0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ca,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_158.pos = local_158.pos + 1;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_158);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,local_158.pos == ppStack_130);
  local_1c0.pos = (pointer)0x0;
  if (local_158.pos != ppStack_130) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cc,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_1a8,this_02,(int *)&local_1d8);
  local_1a8._24_8_ = local_d8;
  local_1c0.pos = (pointer)((long)local_60 + local_78 * 8);
  local_1c0.ht = this_02;
  local_1c0.end = local_1c0.pos;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ != local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ == local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"ht.find(this->UniqueKey(1)) != ht.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ce,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 1;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_02,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"1u","ht.count(this->UniqueKey(1))",(uint *)&local_1d0,
             (unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cf,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,this_02,(int *)&local_1c0);
  local_118.end = (pointer)local_1a8._16_8_;
  local_118.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_118.pos = (pointer)local_1a8._8_8_;
  local_f8 = (undefined1 *)local_1a8._24_8_;
  ppStack_f0 = ppStack_188;
  local_e8 = local_180;
  plStack_100 = (long *)local_d8;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ != ppStack_188);
  local_1c0.pos = (pointer)0x0;
  plStack_e0 = plStack_100;
  if ((pointer)local_1a8._8_8_ == ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d1,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  uVar5 = (**(code **)(*plStack_100 + 0x58))();
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,uVar5);
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d0.data_._0_4_ = pVar6.first;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"const_eq_pair.first.key()","this->UniqueKey(1)",
             (int *)&local_1c0,(int *)&local_1d0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d2,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_118.pos = local_118.pos + 1;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_118);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,local_118.pos == ppStack_f0);
  local_1c0.pos = (pointer)0x0;
  if (local_118.pos != ppStack_f0) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d4,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_1a8,&this_01->rep,(int *)&local_1d8);
  local_1c0.pos =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table +
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_1c0.ht = &this_01->rep;
  local_1c0.end = local_1c0.pos;
  local_1a8._24_8_ = this_00;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ != local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ == local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11111)) != this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d6,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&(((ht *)&(local_1c0.ht)->settings)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 1;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"1u","this->ht_.count(this->UniqueKey(11111))",(uint *)&local_1d0
             ,(unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d7,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,&this_01->rep,(int *)&local_1c0);
  local_158.end = (pointer)local_1a8._16_8_;
  local_158.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_158.pos = (pointer)local_1a8._8_8_;
  local_128 = local_180;
  local_138 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_1a8._24_8_;
  ppStack_130 = ppStack_188;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ != ppStack_188);
  local_1c0.pos = (pointer)0x0;
  local_140 = this_00;
  local_120 = this_00;
  if ((pointer)local_1a8._8_8_ == ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d9,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  iVar4 = (*(local_140->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,iVar4);
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d0.data_._0_4_ = pVar6.first;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"eq_pair.first.key()","this->UniqueKey(11111)",(int *)&local_1c0,
             (int *)&local_1d0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2da,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_158.pos = local_158.pos + 1;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_158);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,local_158.pos == ppStack_130);
  local_1c0.pos = (pointer)0x0;
  if (local_158.pos != ppStack_130) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2dc,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_1a8,this_02,(int *)&local_1d8);
  local_1a8._24_8_ = local_d8;
  local_1c0.pos = (pointer)((long)local_60 + local_78 * 8);
  local_1c0.ht = this_02;
  local_1c0.end = local_1c0.pos;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ != local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ == local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"ht.find(this->UniqueKey(11111)) != ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2de,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 1;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_02,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"1u","ht.count(this->UniqueKey(11111))",(uint *)&local_1d0,
             (unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2df,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,this_02,(int *)&local_1c0);
  local_118.end = (pointer)local_1a8._16_8_;
  local_118.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_118.pos = (pointer)local_1a8._8_8_;
  local_e8 = local_180;
  local_f8 = (undefined1 *)local_1a8._24_8_;
  ppStack_f0 = ppStack_188;
  plStack_100 = (long *)local_d8;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ != ppStack_188);
  local_1c0.pos = (pointer)0x0;
  plStack_e0 = plStack_100;
  if ((pointer)local_1a8._8_8_ == ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e1,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  uVar5 = (**(code **)(*plStack_100 + 0x58))();
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,uVar5);
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  local_1d0.data_._0_4_ = pVar6.first;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"const_eq_pair.first.key()","this->UniqueKey(11111)",
             (int *)&local_1c0,(int *)&local_1d0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e2,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_118.pos = local_118.pos + 1;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_118);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,local_118.pos == ppStack_f0);
  local_1c0.pos = (pointer)0x0;
  if (local_118.pos != ppStack_f0) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e4,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_1a8,&this_01->rep,(int *)&local_1d8);
  local_1c0.pos =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table +
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_1c0.ht = &this_01->rep;
  local_1c0.end = local_1c0.pos;
  local_1a8._24_8_ = this_00;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ == local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ != local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11112)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e7,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&(((ht *)&(local_1c0.ht)->settings)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 0;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"0u","this->ht_.count(this->UniqueKey(11112))",(uint *)&local_1d0
             ,(unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e8,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,&this_01->rep,(int *)&local_1c0);
  local_158.end = (pointer)local_1a8._16_8_;
  local_158.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_158.pos = (pointer)local_1a8._8_8_;
  local_128 = local_180;
  local_138 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_1a8._24_8_;
  ppStack_130 = ppStack_188;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ == ppStack_188);
  local_1c0.pos = (pointer)0x0;
  local_140 = this_00;
  local_120 = this_00;
  if ((pointer)local_1a8._8_8_ != ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ea,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_1a8,this_02,(int *)&local_1d8);
  local_1a8._24_8_ = local_d8;
  local_1c0.pos = (pointer)((long)local_60 + local_78 * 8);
  local_1c0.ht = this_02;
  local_1c0.end = local_1c0.pos;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ == local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ != local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"ht.find(this->UniqueKey(11112)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ec,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 0;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_02,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"0u","ht.count(this->UniqueKey(11112))",(uint *)&local_1d0,
             (unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ed,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b68);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,this_02,(int *)&local_1c0);
  local_118.end = (pointer)local_1a8._16_8_;
  local_118.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_118.pos = (pointer)local_1a8._8_8_;
  local_e8 = local_180;
  local_f8 = (undefined1 *)local_1a8._24_8_;
  ppStack_f0 = ppStack_188;
  plStack_100 = (long *)local_d8;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ == ppStack_188);
  local_1c0.pos = (pointer)0x0;
  plStack_e0 = plStack_100;
  if ((pointer)local_1a8._8_8_ != ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ef,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_1a8,&this_01->rep,(int *)&local_1d8);
  local_1c0.pos =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table +
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_1c0.ht = &this_01->rep;
  local_1c0.end = local_1c0.pos;
  local_1a8._24_8_ = this_00;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ == local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ != local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11110)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f1,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&(((ht *)&(local_1c0.ht)->settings)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 0;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"0u","this->ht_.count(this->UniqueKey(11110))",(uint *)&local_1d0
             ,(unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f2,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,&this_01->rep,(int *)&local_1c0);
  local_158.end = (pointer)local_1a8._16_8_;
  local_158.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_158.pos = (pointer)local_1a8._8_8_;
  local_128 = local_180;
  local_138 = (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_1a8._24_8_;
  ppStack_130 = ppStack_188;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ == ppStack_188);
  local_1c0.pos = (pointer)0x0;
  local_140 = this_00;
  local_120 = this_00;
  if ((pointer)local_1a8._8_8_ != ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f4,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1d8.data_._0_4_ = pVar6.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_1a8,this_02,(int *)&local_1d8);
  local_1a8._24_8_ = local_d8;
  local_1c0.pos = (pointer)((long)local_60 + local_78 * 8);
  local_1c0.ht = this_02;
  local_1c0.end = local_1c0.pos;
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_1c0);
  local_1d0.data_._0_4_ = CONCAT31(local_1d0.data_._1_3_,(pointer)local_1a8._8_8_ == local_1c0.pos);
  local_1c8 = (undefined8 *)0x0;
  if ((pointer)local_1a8._8_8_ != local_1c0.pos) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"ht.find(this->UniqueKey(11110)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f6,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_1d0.data_._0_4_ = 0;
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1d8.data_._0_4_ = pVar6.first;
  pVar8 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_02,(int *)&local_1d8);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar8.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a8,"0u","ht.count(this->UniqueKey(11110))",(uint *)&local_1d0,
             (unsigned_long *)&local_1c0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pVar6 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar6 = *(pair<const_int,_int> *)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f7,(char *)pVar6);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_1a8._8_8_;
  if ((pointer)local_1a8._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_1a8._8_8_ != (pair<const_int,_int>)(local_1a8._8_8_ + 0x10))
    {
      operator_delete((void *)*(pair<const_int,_int> *)local_1a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  pVar6 = UniqueObjectHelper<std::pair<int_const,int>>(0x2b66);
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,pVar6.first);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_1a8,this_02,(int *)&local_1c0);
  local_118.end = (pointer)local_1a8._16_8_;
  local_118.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_1a8._0_8_;
  local_118.pos = (pointer)local_1a8._8_8_;
  local_e8 = local_180;
  local_f8 = (undefined1 *)local_1a8._24_8_;
  ppStack_f0 = ppStack_188;
  plStack_100 = (long *)local_d8;
  local_1c0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,(pointer)local_1a8._8_8_ == ppStack_188);
  local_1c0.pos = (pointer)0x0;
  plStack_e0 = plStack_100;
  if ((pointer)local_1a8._8_8_ != ppStack_188) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1c0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f9,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(int)local_1d0.data_) + 8))();
    }
  }
  ppVar2 = local_1c0.pos;
  if (local_1c0.pos != (pointer)0x0) {
    if (*local_1c0.pos != (pair<const_int,_int>)(local_1c0.pos + 2)) {
      operator_delete((void *)*local_1c0.pos);
    }
    operator_delete(ppVar2);
  }
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c233e8;
  if (local_60 != (void *)0x0) {
    free(local_60);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}